

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O1

void NetworkDataType::
     deserializedata<unsigned_char,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
               (binarydata *data,uchar *args,uchar *args_1,unsigned_short *args_2,
               unsigned_short *args_3,unsigned_short *args_4,unsigned_short *args_5,
               unsigned_short *args_6,uchar *args_7,unsigned_short *args_8,uchar *args_9,
               unsigned_short *args_10,unsigned_short *args_11,unsigned_short *args_12,
               unsigned_short *args_13)

{
  unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
  *puVar1;
  pointer pcVar2;
  Options local_2c1;
  unsigned_short *local_2c0;
  PortableBinaryInputArchive archive;
  stringstream stream;
  ios_base aiStack_138 [264];
  
  puVar1 = &archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.itsBaseClassSet;
  pcVar2 = (data->str)._M_dataplus._M_p;
  local_2c0 = args_4;
  archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&archive,pcVar2,pcVar2 + (data->str)._M_string_length);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&archive,_S_out|_S_in);
  if ((unordered_set<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id_hash,_std::equal_to<cereal::traits::detail::base_class_id>,_std::allocator<cereal::traits::detail::base_class_id>_>
       *)archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase.
         _vptr_InputArchiveBase != puVar1) {
    operator_delete(archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                    super_InputArchiveBase._vptr_InputArchiveBase,
                    (long)archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                          itsBaseClassSet._M_h._M_buckets + 1);
  }
  local_2c1.itsInputEndianness = cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (&archive,(istream *)&stream,&local_2c1);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            (((archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,args,1);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            (((archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,args_1,1);
  cereal::PortableBinaryInputArchive::loadBinary<2ul>
            (((archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,args_2,2);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
  process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)&archive,args_3,local_2c0,args_5
             ,args_6,args_7,args_8,args_9,args_10,args_11,args_12,args_13);
  archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_003edfb0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsVersionedTypes._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsPolymorphicTypeMap._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<void>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.
                 itsSharedPointerMap._M_h);
  std::
  _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>.itsBaseClassSet.
                 _M_h);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }